

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void nn_req_in(nn_sockbase *self,nn_pipe *pipe)

{
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  size_t sVar4;
  uint8_t *buf;
  nn_chunkref *in_RSI;
  nn_req *in_RDI;
  uint32_t reqid;
  nn_req *req;
  int rc;
  undefined8 in_stack_ffffffffffffffc8;
  FILE *__stream;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  nn_req *self_00;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  if (in_RDI == (nn_req *)0x0) {
    in_RDI = (nn_req *)0x0;
  }
  self_00 = in_RDI;
  nn_xreq_in((nn_sockbase *)in_RDI,
             (nn_pipe *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  while( true ) {
    in_stack_ffffffffffffffec =
         nn_xreq_recv((nn_sockbase *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (nn_msg *)self_00);
    if (in_stack_ffffffffffffffec == -0xb) {
      return;
    }
    if (in_stack_ffffffffffffffec != 0) break;
    iVar1 = nn_req_inprogress(self_00);
    if (iVar1 == 0) {
      nn_msg_term((nn_msg *)0x13f495);
    }
    else {
      sVar4 = nn_chunkref_size((nn_chunkref *)in_RDI);
      if (sVar4 == 4) {
        buf = (uint8_t *)nn_chunkref_data(&(self_00->task).reply.sphdr);
        uVar2 = nn_getl(buf);
        iVar1 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
        if ((uVar2 & 0x80000000) == 0) {
          nn_msg_term((nn_msg *)0x13f531);
        }
        else {
          if (uVar2 == ((self_00->task).id | 0x80000000)) {
            nn_chunkref_term((nn_chunkref *)in_RDI);
            nn_chunkref_init(in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
            if (self_00->state != 4) {
              return;
            }
            nn_fsm_action((nn_fsm *)in_RDI,iVar1);
            return;
          }
          nn_msg_term((nn_msg *)0x13f572);
        }
      }
      else {
        nn_msg_term((nn_msg *)0x13f4d8);
      }
    }
  }
  nn_backtrace_print();
  __stream = _stderr;
  pcVar3 = nn_err_strerror((int)((ulong)_stderr >> 0x20));
  fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-in_stack_ffffffffffffffec,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
          ,0x9e);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_req_in (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    int rc;
    struct nn_req *req;
    uint32_t reqid;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    /*  Pass the pipe to the raw REQ socket. */
    nn_xreq_in (&req->xreq.sockbase, pipe);

    while (1) {

        /*  Get new reply. */
        rc = nn_xreq_recv (&req->xreq.sockbase, &req->task.reply);
        if (nn_slow (rc == -EAGAIN))
            return;
        errnum_assert (rc == 0, -rc);

        /*  No request was sent. Getting a reply doesn't make sense. */
        if (nn_slow (!nn_req_inprogress (req))) {
            nn_msg_term (&req->task.reply);
            continue;
        }

        /*  Ignore malformed replies. */
        if (nn_slow (nn_chunkref_size (&req->task.reply.sphdr) !=
              sizeof (uint32_t))) {
            nn_msg_term (&req->task.reply);
            continue;
        }

        /*  Ignore replies with incorrect request IDs. */
        reqid = nn_getl (nn_chunkref_data (&req->task.reply.sphdr));
        if (nn_slow (!(reqid & 0x80000000))) {
            nn_msg_term (&req->task.reply);
            continue;
        }
        if (nn_slow (reqid != (req->task.id | 0x80000000))) {
            nn_msg_term (&req->task.reply);
            continue;
        }

        /*  Trim the request ID. */
        nn_chunkref_term (&req->task.reply.sphdr);
        nn_chunkref_init (&req->task.reply.sphdr, 0);

        /*  TODO: Deallocate the request here? */

        /*  Notify the state machine. */
        if (req->state == NN_REQ_STATE_ACTIVE)
            nn_fsm_action (&req->fsm, NN_REQ_ACTION_IN);

        return;
    }
}